

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O3

float PsiER(float *ve,float *va)

{
  undefined8 uVar1;
  double dVar2;
  int i;
  long lVar3;
  float sum;
  float fVar4;
  float fVar5;
  float fVar6;
  double __x;
  undefined4 local_58;
  undefined8 local_48;
  undefined4 local_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  uVar1 = *(undefined8 *)ve;
  local_38 = uVar1;
  local_30 = 0x3f800000;
  local_28 = *(undefined8 *)va;
  uStack_20 = 0;
  local_48 = local_28;
  local_40 = 0x3f800000;
  fVar4 = 0.0;
  lVar3 = 0;
  do {
    fVar5 = *(float *)((long)&local_48 + lVar3 * 4);
    fVar4 = fVar4 + fVar5 * fVar5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar5 = 0.0;
  lVar3 = 0;
  do {
    fVar6 = *(float *)((long)&local_38 + lVar3 * 4);
    fVar5 = fVar5 + fVar6 * fVar6;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar6 = ((float)uVar1 * (float)local_28 + (float)((ulong)uVar1 >> 0x20) * local_28._4_4_ + 1.0) /
          (fVar4 * fVar5);
  __x = (double)fVar6;
  if (1.0 < fVar6) {
    __x = (double)(-(ulong)(__x < 1.0001) & 0x3ff0000000000000 |
                  ~-(ulong)(__x < 1.0001) & (ulong)__x);
  }
  dVar2 = acos(__x);
  fVar6 = (float)((dVar2 * 180.0) / 3.141592653589793);
  if ((fVar6 < 0.0) || (180.0 <= fVar6)) {
    local_58 = SUB84(__x,0);
    printf("ERROR in PSIER()...\n r=%8.4f  v=%8.4f  nva=%8.4f nve= %8.4f\n",SUB84((double)fVar6,0),
           local_58,(double)fVar4,(double)fVar5);
    printf("va=(%f,%f) ve=(%f,%f)\n",SUB84((double)*va,0),SUB84((double)va[1],0),(double)*ve,
           (double)ve[1]);
  }
  return fVar6;
}

Assistant:

float PsiER(float ve[], float va[])
{
float nva;
float nve;
float v,r;
float VE[3],VA[3];

VE[0] = ve[0];
VE[1] = ve[1];
VE[2] = 1.0;

VA[0] = va[0];
VA[1] = va[1];
VA[2] = 1.0;

nva = norm(VA,3);
nve = norm(VE,3);
v =  (VE[0]*VA[0]+VE[1]*VA[1]+1.0f)/(nva*nve);

/**  sometimes roundoff error causes problems **/
if(v>1.0 && v < 1.0001) v = 1.0;

r = (float) (acos(v)*180.0/HALF_C);

if (!(r>=0.0 && r< 180.0))
{
printf("ERROR in PSIER()...\n r=%8.4f  v=%8.4f  nva=%8.4f nve= %8.4f\n",r,v,nva,nve);
printf("va=(%f,%f) ve=(%f,%f)\n",va[0],va[1],ve[0],ve[1]);
}

return r;
}